

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O1

void Ivy_FastMapPerform(Ivy_Man_t *pAig,int nLimit,int fRecovery,int fVerbose)

{
  char cVar1;
  ushort uVar2;
  void **ppvVar3;
  ulong uVar4;
  ulong uVar5;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pIVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  void *pvVar11;
  undefined8 *puVar12;
  Vec_Ptr_t *pVVar13;
  ushort uVar14;
  int iVar15;
  undefined4 uVar16;
  long lVar17;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  size_t __size;
  int iVar18;
  Ivy_Supp_t *pIVar19;
  undefined4 in_register_00000034;
  long lVar20;
  Ivy_Supp_t *pIVar21;
  char *in_R8;
  long lVar22;
  Ivy_Supp_t *pIVar23;
  Ivy_Supp_t *pIVar24;
  Ivy_Man_t *pIVar25;
  bool bVar26;
  timespec ts;
  timespec local_a8;
  Ivy_Man_t *local_98;
  undefined8 local_90;
  int local_84;
  int local_80;
  int local_7c;
  Ivy_Supp_t *local_78;
  long local_70;
  long local_68;
  int local_5c;
  long local_58;
  int *local_50;
  int *local_48;
  long local_40;
  int *local_38;
  
  local_90 = CONCAT44(in_register_00000034,nLimit);
  local_70 = CONCAT44(local_70._4_4_,fRecovery);
  local_98 = pAig;
  iVar7 = clock_gettime(3,&local_a8);
  iVar18 = 1;
  local_40 = 1;
  if (-1 < iVar7) {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    local_40 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  piVar10 = (int *)malloc(0x20);
  pIVar25 = local_98;
  piVar10[0] = 0;
  piVar10[1] = 0;
  piVar10[2] = 0;
  piVar10[3] = 0;
  piVar10[4] = 0;
  piVar10[5] = 0;
  piVar10[6] = 0;
  piVar10[7] = 0;
  *piVar10 = (int)local_90;
  iVar7 = local_98->vObjs->nSize;
  piVar10[1] = iVar7;
  iVar15 = (int)local_90 * 4 + 0xc;
  piVar10[2] = iVar15;
  __size = (size_t)(iVar7 * iVar15);
  pvVar11 = malloc(__size);
  *(void **)(piVar10 + 4) = pvVar11;
  memset(pvVar11,0,__size);
  puVar12 = (undefined8 *)malloc(0x10);
  *puVar12 = 100;
  pvVar11 = malloc(800);
  puVar12[1] = pvVar11;
  *(undefined8 **)(piVar10 + 6) = puVar12;
  pIVar25->pData = piVar10;
  local_48 = piVar10;
  iVar7 = clock_gettime(3,&local_a8);
  if (-1 < iVar7) {
    iVar18 = ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8) >> 7) -
             (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),0xc) >> 0x1f)) +
             (int)local_a8.tv_sec * -1000000;
  }
  pvVar11 = pIVar25->pData;
  lVar17 = *(long *)((long)pvVar11 + 0x10);
  iVar7 = pIVar25->pConst1->Id;
  lVar20 = (long)*(int *)((long)pvVar11 + 8) * (long)iVar7;
  *(undefined2 *)(lVar17 + 8 + lVar20) = 0;
  *(undefined2 *)(lVar17 + lVar20) = 1;
  *(int *)(lVar17 + 0xc + lVar20) = iVar7;
  pVVar13 = pIVar25->vPis;
  if (0 < pVVar13->nSize) {
    ppvVar3 = pVVar13->pArray;
    lVar20 = 0;
    do {
      iVar7 = *ppvVar3[lVar20];
      lVar22 = (long)*(int *)((long)pvVar11 + 8) * (long)iVar7;
      *(undefined2 *)(lVar17 + 8 + lVar22) = 0;
      *(undefined2 *)(lVar17 + lVar22) = 1;
      *(int *)(lVar17 + 0xc + lVar22) = iVar7;
      lVar20 = lVar20 + 1;
      in_R8 = (char *)(long)pVVar13->nSize;
    } while (lVar20 < (long)in_R8);
  }
  pVVar13 = pIVar25->vObjs;
  local_80 = fVerbose;
  if (0 < pVVar13->nSize) {
    lVar17 = 0;
    do {
      pIVar6 = local_98;
      piVar10 = (int *)pVVar13->pArray[lVar17];
      if ((piVar10 != (int *)0x0) && (bVar26 = (piVar10[2] & 0xfU) - 7 < 0xfffffffe, !bVar26)) {
        if (bVar26) {
          __assert_fail("Ivy_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                        ,0x222,"void Ivy_FastMapNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
        }
        uVar4 = *(ulong *)(piVar10 + 4);
        uVar5 = *(ulong *)(piVar10 + 6);
        lVar20 = *(long *)((long)pIVar25->pData + 0x10);
        uVar8 = *(uint *)(uVar4 & 0xfffffffffffffffe);
        in_R8 = (char *)(ulong)uVar8;
        iVar7 = *(int *)((long)pIVar25->pData + 8);
        lVar22 = (long)iVar7;
        pIVar23 = (Ivy_Supp_t *)(lVar20 + (int)(iVar7 * uVar8));
        iVar15 = *(int *)(uVar5 & 0xfffffffffffffffe);
        pIVar19 = (Ivy_Supp_t *)(lVar20 + iVar15 * iVar7);
        pIVar24 = (Ivy_Supp_t *)(lVar20 + *piVar10 * lVar22);
        *(undefined1 *)(lVar20 + 1 + *piVar10 * lVar22) = 0;
        uVar2 = *(ushort *)(lVar20 + 8 + (long)(int)(iVar7 * uVar8));
        uVar14 = *(ushort *)(lVar20 + 8 + (long)(iVar15 * iVar7));
        if (uVar2 == uVar14) {
          uVar14 = 1;
          if (1 < uVar2) {
            uVar14 = uVar2;
          }
          pIVar24->Delay = uVar14;
        }
        else if ((short)uVar14 < (short)uVar2) {
          pIVar24->Delay = uVar2;
          lVar22 = local_98->pConst1->Id * lVar22;
          pIVar19 = (Ivy_Supp_t *)(lVar20 + lVar22);
          if (uVar5 == 0) {
            iVar15 = 0;
          }
          *(int *)(lVar20 + 0xc + lVar22) = iVar15;
        }
        else {
          pIVar24->Delay = uVar14;
          lVar22 = local_98->pConst1->Id * lVar22;
          pIVar23 = (Ivy_Supp_t *)(lVar20 + lVar22);
          if (uVar4 == 0) {
            uVar8 = 0;
          }
          in_R8 = (char *)(ulong)uVar8;
          *(uint *)(lVar20 + 0xc + lVar22) = uVar8;
        }
        pIVar21 = pIVar19;
        if (pIVar23->nSize < pIVar19->nSize) {
          pIVar21 = pIVar23;
          pIVar23 = pIVar19;
        }
        iVar7 = Ivy_FastMapMerge(pIVar23,pIVar21,pIVar24,(int)local_90);
        if (iVar7 == 0) {
          pIVar24->Delay = pIVar24->Delay + 1;
          pIVar24->nSize = '\x02';
          iVar7 = 0;
          uVar16 = 0;
          if (*(ulong *)(piVar10 + 4) != 0) {
            uVar16 = *(undefined4 *)(*(ulong *)(piVar10 + 4) & 0xfffffffffffffffe);
          }
          pIVar24[1].nSize = (char)uVar16;
          pIVar24[1].fMark = (char)((uint)uVar16 >> 8);
          pIVar24[1].fMark2 = (char)((uint)uVar16 >> 0x10);
          pIVar24[1].fMark3 = (char)((uint)uVar16 >> 0x18);
          if (*(ulong *)(piVar10 + 6) != 0) {
            iVar7 = *(int *)(*(ulong *)(piVar10 + 6) & 0xfffffffffffffffe);
          }
          pIVar24[1].nRefs = iVar7;
        }
        pIVar25 = pIVar6;
        if (pIVar24->Delay < 1) {
          __assert_fail("pSupp->Delay > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                        ,0x2b5,"void Ivy_FastMapNode(Ivy_Man_t *, Ivy_Obj_t *, int)");
        }
      }
      lVar17 = lVar17 + 1;
      pVVar13 = pIVar25->vObjs;
    } while (lVar17 < pVVar13->nSize);
  }
  uVar8 = Ivy_FastMapDelay(pIVar25);
  iVar15 = Ivy_FastMapArea(pIVar25);
  iVar7 = local_80;
  if (local_80 != 0) {
    iVar9 = clock_gettime(3,&local_a8);
    if (iVar9 < 0) {
      iVar9 = -1;
    }
    else {
      iVar9 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
    }
    Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar15,iVar9 + iVar18,0x994f66,in_R8);
  }
  if ((int)local_70 != 0) {
    iVar18 = clock_gettime(3,&local_a8);
    pIVar25 = local_98;
    if (iVar18 < 0) {
      iVar18 = 1;
      lVar17 = extraout_RDX;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      iVar18 = ((int)(lVar17 >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),0xc) >> 0x1f)) +
               (int)local_a8.tv_sec * -1000000;
    }
    Ivy_FastMapRequired(local_98,uVar8,(int)lVar17);
    Ivy_FastMapRecover(pIVar25,(int)local_90);
    uVar8 = Ivy_FastMapDelay(pIVar25);
    iVar15 = Ivy_FastMapArea(pIVar25);
    if (iVar7 != 0) {
      iVar7 = clock_gettime(3,&local_a8);
      if (iVar7 < 0) {
        iVar7 = -1;
      }
      else {
        iVar7 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
      }
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar15,iVar7 + iVar18,0x994f7f,in_R8);
    }
    iVar7 = clock_gettime(3,&local_a8);
    pIVar25 = local_98;
    if (iVar7 < 0) {
      local_68 = 1;
      lVar17 = extraout_RDX_00;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      lVar17 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_a8.tv_sec * -1000000;
      local_68 = lVar17;
    }
    Ivy_FastMapRequired(local_98,uVar8,(int)lVar17);
    pVVar13 = pIVar25->vObjs;
    if (0 < pVVar13->nSize) {
      lVar17 = 0;
      do {
        pObj = (Ivy_Obj_t *)pVVar13->pArray[lVar17];
        if ((pObj != (Ivy_Obj_t *)0x0) &&
           (uVar8 = (*(uint *)&pObj->field_0x8 & 0xf) - 7, 0xfffffffd < uVar8)) {
          if (0x20 < (int)local_90) {
            __assert_fail("nLimit <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1c3,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          if (uVar8 < 0xfffffffe) {
            __assert_fail("Ivy_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1c4,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          lVar20 = *(long *)((long)pIVar25->pData + 0x10);
          local_70 = (long)*(int *)((long)pIVar25->pData + 8);
          lVar22 = pObj->Id * local_70;
          if (*(char *)(lVar20 + 1 + lVar22) != '\0') {
            __assert_fail("pSupp->fMark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1cc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          local_38 = (int *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
          local_50 = (int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
          local_78 = (Ivy_Supp_t *)(long)*local_38;
          local_58 = (long)*local_50;
          pIVar23 = (Ivy_Supp_t *)(lVar22 + lVar20);
          if (pIVar23->nRefs == 0) {
            local_84 = Ivy_FastMapNodeAreaDerefed(local_98,pObj);
          }
          else {
            local_84 = Ivy_FastMapNodeAreaRefed(local_98,pObj);
          }
          pIVar25 = local_98;
          if (pIVar23->nRefs != 0) {
            Ivy_FastMapNodeDeref(local_98,pObj);
          }
          local_5c = Ivy_FastMapNodeDelay(pIVar25,pObj);
          local_7c = (int)pIVar23->DelayR;
          if (local_7c < local_5c) {
            __assert_fail("DelayOld <= pSupp->DelayR",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFastMap.c"
                          ,0x1dc,"void Ivy_FastMapNodeArea(Ivy_Man_t *, Ivy_Obj_t *, int)");
          }
          pIVar19 = (Ivy_Supp_t *)((long)local_78 * local_70 + lVar20);
          local_78 = pIVar23 + 1;
          cVar1 = pIVar23->nSize;
          memcpy(Ivy_FastMapNodeArea_Store,local_78,(long)(int)cVar1 * 4);
          iVar7 = local_84;
          if ((2 < local_38[3]) && (pIVar19->Delay < (short)local_7c)) {
            Ivy_FastMapNodeArea_Supp0 = 1;
            if (pObj->pFanin0 == (Ivy_Obj_t *)0x0) {
              _DAT_00cd879c = 0;
            }
            else {
              _DAT_00cd879c = *(undefined4 *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
            }
            pIVar19 = (Ivy_Supp_t *)&Ivy_FastMapNodeArea_Supp0;
          }
          pIVar24 = (Ivy_Supp_t *)(lVar20 + local_58 * local_70);
          if ((2 < local_50[3]) && (pIVar24->Delay < (short)local_7c)) {
            Ivy_FastMapNodeArea_Supp1 = 1;
            if (pObj->pFanin1 == (Ivy_Obj_t *)0x0) {
              _DAT_00cd87ac = 0;
            }
            else {
              _DAT_00cd87ac = *(undefined4 *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            }
            pIVar24 = (Ivy_Supp_t *)&Ivy_FastMapNodeArea_Supp1;
          }
          pIVar21 = pIVar24;
          if (pIVar19->nSize < pIVar24->nSize) {
            pIVar21 = pIVar19;
            pIVar19 = pIVar24;
          }
          _Ivy_FastMapNodeArea_StoreSize = (int)cVar1;
          iVar18 = Ivy_FastMapMerge(pIVar19,pIVar21,pIVar23,(int)local_90);
          pIVar25 = local_98;
          if (iVar18 == 0) {
            pIVar23->nSize = '\x02';
            iVar18 = 0;
            uVar16 = 0;
            if (pObj->pFanin0 != (Ivy_Obj_t *)0x0) {
              uVar16 = *(undefined4 *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
            }
            local_78->nSize = (char)uVar16;
            local_78->fMark = (char)((uint)uVar16 >> 8);
            local_78->fMark2 = (char)((uint)uVar16 >> 0x10);
            local_78->fMark3 = (char)((uint)uVar16 >> 0x18);
            if (pObj->pFanin1 != (Ivy_Obj_t *)0x0) {
              iVar18 = *(int *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
            }
            pIVar23[1].nRefs = iVar18;
          }
          iVar18 = Ivy_FastMapNodeDelay(local_98,pObj);
          pIVar23->Delay = (short)iVar18;
          iVar18 = pIVar23->nRefs;
          pIVar23->nRefs = 0;
          iVar15 = Ivy_FastMapNodeAreaDerefed(pIVar25,pObj);
          pIVar23->nRefs = iVar18;
          if ((iVar7 < iVar15) || (pIVar23->DelayR < pIVar23->Delay)) {
            lVar20 = (long)Ivy_FastMapNodeArea_StoreSize;
            pIVar23->nSize = Ivy_FastMapNodeArea_StoreSize;
            memcpy(local_78,Ivy_FastMapNodeArea_Store,lVar20 << 2);
            pIVar23->Delay = (short)local_5c;
          }
          if (pIVar23->nRefs != 0) {
            Ivy_FastMapNodeRef(pIVar25,pObj);
          }
        }
        lVar17 = lVar17 + 1;
        pVVar13 = pIVar25->vObjs;
      } while (lVar17 < pVVar13->nSize);
    }
    uVar8 = Ivy_FastMapDelay(pIVar25);
    iVar18 = Ivy_FastMapArea(pIVar25);
    iVar7 = local_80;
    if (local_80 != 0) {
      iVar15 = clock_gettime(3,&local_a8);
      if (iVar15 < 0) {
        iVar15 = -1;
      }
      else {
        iVar15 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
      }
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar18,iVar15 + (int)local_68,0x994f98,in_R8);
    }
    iVar18 = clock_gettime(3,&local_a8);
    pIVar25 = local_98;
    if (iVar18 < 0) {
      iVar18 = 1;
      lVar17 = extraout_RDX_01;
    }
    else {
      lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
      iVar18 = ((int)(lVar17 >> 7) -
               (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),0xc) >> 0x1f)) +
               (int)local_a8.tv_sec * -1000000;
    }
    Ivy_FastMapRequired(local_98,uVar8,(int)lVar17);
    Ivy_FastMapRecover(pIVar25,(int)local_90);
    uVar8 = Ivy_FastMapDelay(pIVar25);
    iVar15 = Ivy_FastMapArea(pIVar25);
    if (iVar7 != 0) {
      iVar7 = clock_gettime(3,&local_a8);
      if (iVar7 < 0) {
        iVar7 = -1;
      }
      else {
        iVar7 = (int)(local_a8.tv_nsec / 1000) + (int)local_a8.tv_sec * 1000000;
      }
      Ivy_FastMapPrint((Ivy_Man_t *)(ulong)uVar8,iVar15,iVar7 + iVar18,0x994f7f,in_R8);
    }
  }
  iVar7 = clock_gettime(3,&local_a8);
  if (iVar7 < 0) {
    lVar17 = -1;
  }
  else {
    lVar17 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  s_MappingTime = lVar17 + local_40;
  s_MappingMem = local_48[2] * local_48[1];
  return;
}

Assistant:

void Ivy_FastMapPerform( Ivy_Man_t * pAig, int nLimit, int fRecovery, int fVerbose )
{
    Ivy_SuppMan_t * pMan;
    Ivy_Obj_t * pObj;
    int i, Delay, Area;
    abctime clk, clkTotal = Abc_Clock();
    // start the memory for supports
    pMan = ABC_ALLOC( Ivy_SuppMan_t, 1 );
    memset( pMan, 0, sizeof(Ivy_SuppMan_t) );
    pMan->nLimit = nLimit;
    pMan->nObjs  = Ivy_ManObjIdMax(pAig) + 1;
    pMan->nSize  = sizeof(Ivy_Supp_t) + nLimit * sizeof(int);
    pMan->pMem   = (char *)ABC_ALLOC( char, pMan->nObjs * pMan->nSize );
    memset( pMan->pMem, 0, pMan->nObjs * pMan->nSize );
    pMan->vLuts  = Vec_VecAlloc( 100 );
    pAig->pData  = pMan;
clk = Abc_Clock();
    // set the PI mapping
    Ivy_ObjSuppStart( pAig, Ivy_ManConst1(pAig) );
    Ivy_ManForEachPi( pAig, pObj, i )
        Ivy_ObjSuppStart( pAig, pObj );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNode( pAig, pObj, nLimit );
    // find the best arrival time and area
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Delay oriented mapping: " );

// 2-1-2 (doing 2-1-2-1-2 improves 0.5%)

    if ( fRecovery )
    {
clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // iterate through all nodes in the topological order
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_FastMapNodeArea( pAig, pObj, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 1       : " );

clk = Abc_Clock();
    Ivy_FastMapRequired( pAig, Delay, 0 );
    // remap the nodes
    Ivy_FastMapRecover( pAig, nLimit );
    Delay = Ivy_FastMapDelay( pAig );
    Area = Ivy_FastMapArea(pAig);
    if ( fVerbose )
        Ivy_FastMapPrint( pAig, Delay, Area, Abc_Clock() - clk, "Area recovery 2       : " );
    }


    s_MappingTime = Abc_Clock() - clkTotal;
    s_MappingMem = pMan->nObjs * pMan->nSize;
/*
    {
        Vec_Ptr_t * vNodes;
        vNodes = Vec_PtrAlloc( 100 );
        Vec_VecForEachEntry( Ivy_Obj_t *, pMan->vLuts, pObj, i, k )
            Vec_PtrPush( vNodes, pObj );
        Ivy_ManShow( pAig, 0, vNodes );
        Vec_PtrFree( vNodes );
    }
*/
}